

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageLabelDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper
          (QPDFPageLabelDocumentHelper *this,QPDF *qpdf)

{
  bool bVar1;
  Members *this_00;
  element_type *this_01;
  allocator<char> local_a1;
  string local_a0 [32];
  QPDFObjectHandle local_80;
  QPDFObjectHandle local_70;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  QPDFObjectHandle root;
  QPDF *qpdf_local;
  QPDFPageLabelDocumentHelper *this_local;
  
  QPDFDocumentHelper::QPDFDocumentHelper(&this->super_QPDFDocumentHelper,qpdf);
  (this->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper =
       (_func_int **)&PTR__QPDFPageLabelDocumentHelper_0058ca88;
  this_00 = (Members *)operator_new(0x10);
  (this_00->labels).super___shared_ptr<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this_00->labels).super___shared_ptr<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Members::Members(this_00);
  std::shared_ptr<QPDFPageLabelDocumentHelper::Members>::
  shared_ptr<QPDFPageLabelDocumentHelper::Members,void>(&this->m,this_00);
  QPDF::getRoot((QPDF *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"/PageLabels",&local_59);
  bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_a0,"/PageLabels",&local_a1);
    QPDFObjectHandle::getKey(&local_80,(string *)local_38);
    std::make_shared<QPDFNumberTreeObjectHelper,QPDFObjectHandle,QPDF&>(&local_70,(QPDF *)&local_80)
    ;
    this_01 = std::
              __shared_ptr_access<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m);
    std::shared_ptr<QPDFNumberTreeObjectHelper>::operator=
              (&this_01->labels,(shared_ptr<QPDFNumberTreeObjectHelper> *)&local_70);
    std::shared_ptr<QPDFNumberTreeObjectHelper>::~shared_ptr
              ((shared_ptr<QPDFNumberTreeObjectHelper> *)&local_70);
    QPDFObjectHandle::~QPDFObjectHandle(&local_80);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_38);
  return;
}

Assistant:

QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper(QPDF& qpdf) :
    QPDFDocumentHelper(qpdf),
    m(new Members())
{
    QPDFObjectHandle root = qpdf.getRoot();
    if (root.hasKey("/PageLabels")) {
        m->labels =
            std::make_shared<QPDFNumberTreeObjectHelper>(root.getKey("/PageLabels"), this->qpdf);
    }
}